

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O2

lzma_ret lzma_properties_decode
                   (lzma_filter *filter,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  lzma_ret lVar1;
  lzma_filter_decoder *plVar2;
  
  plVar2 = decoder_find(filter->id);
  filter->options = (void *)0x0;
  if (plVar2 == (lzma_filter_decoder *)0x0) {
    lVar1 = LZMA_OPTIONS_ERROR;
  }
  else {
    if (plVar2->props_decode !=
        (_func_lzma_ret_void_ptr_ptr_lzma_allocator_ptr_uint8_t_ptr_size_t *)0x0) {
      lVar1 = (*plVar2->props_decode)(&filter->options,allocator,props,props_size);
      return lVar1;
    }
    lVar1 = (uint)(props_size != 0) << 3;
  }
  return lVar1;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_decode(lzma_filter *filter, lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	const lzma_filter_decoder *const fd = decoder_find(filter->id);

	// Make it always NULL so that the caller can always safely free() it.
	filter->options = NULL;

	if (fd == NULL)
		return LZMA_OPTIONS_ERROR;

	if (fd->props_decode == NULL)
		return props_size == 0 ? LZMA_OK : LZMA_OPTIONS_ERROR;

	return fd->props_decode(
			&filter->options, allocator, props, props_size);
}